

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::IsGroupOf_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IsGroupOf_PDU *this)

{
  pointer pKVar1;
  GED *pGVar2;
  ostream *poVar3;
  long lVar4;
  KINT32 Value;
  byte bVar5;
  KString KStack_218;
  KString local_1f8;
  KString local_1d8;
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&KStack_218,&this->super_Header);
  poVar3 = std::operator<<(local_1a8,(string *)&KStack_218);
  poVar3 = std::operator<<(poVar3,"-Is Group Of PDU-\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_GroupedEntityID);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"Grouped Entity Category:         ");
  DATA_TYPE::ENUMS::GetEnumAsStringGroupedEntityCategory_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui8GrpdEntCat,Value);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Of Grouped Entity:        ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumOfGroupedEnts);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"Group Reference Point(Lat,Lon) : ");
  poVar3 = std::ostream::_M_insert<double>((double)this->m_f64GrpLat);
  std::operator<<(poVar3," , ");
  poVar3 = std::ostream::_M_insert<double>((double)this->m_f64GrpLon);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&KStack_218);
  bVar5 = 0;
  while( true ) {
    pKVar1 = (this->m_vpGED).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_vpGED).
                  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar1;
    if ((ulong)(lVar4 / 0x18) <= (ulong)bVar5) break;
    pGVar2 = pKVar1[bVar5].m_pRef;
    (*(pGVar2->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_218,pGVar2,lVar4 % 0x18);
    std::operator<<(local_1a8,(string *)&KStack_218);
    std::__cxx11::string::~string((string *)&KStack_218);
    bVar5 = bVar5 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString IsGroupOf_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Is Group Of PDU-\n"
       << m_GroupedEntityID.GetAsString()
       << "Grouped Entity Category:         " << GetEnumAsStringGroupedEntityCategory( m_ui8GrpdEntCat ) << "\n"
       << "Number Of Grouped Entity:        " << ( KUINT16 )m_ui8NumOfGroupedEnts                        << "\n"
       << "Group Reference Point(Lat,Lon) : " << m_f64GrpLat << " , " << m_f64GrpLon                     << "\n";

    KUINT8 i = 0;

    while( i < m_vpGED.size() )
    {
        ss << m_vpGED[i]->GetAsString();
        ++i;
    }

    return ss.str();
}